

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

uint32_t gravity_object_size(gravity_vm *vm,gravity_object_t *obj)

{
  gravity_hash_compute_fn p_Var1;
  long *plVar2;
  char *pcVar3;
  gravity_hash_t *pgVar4;
  gravity_hash_compute_fn p_Var5;
  gravity_object_t *obj_00;
  gravity_gc_callback UNRECOVERED_JUMPTABLE;
  long *plVar6;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar7;
  _Bool _Var8;
  uint32_t uVar9;
  uint32_t uVar10;
  gravity_delegate_t *pgVar11;
  gravity_class_t *pgVar12;
  int iVar13;
  gravity_class_t *pgVar14;
  gravity_class_s *pgVar15;
  long lVar16;
  gravity_value_t v;
  gravity_value_t v_00;
  
  if (((obj == (gravity_object_t *)0x0) || (pgVar14 = obj->isa, pgVar14 == (gravity_class_t *)0x0))
     || ((obj->gc).visited != false)) {
    return 0;
  }
  UNRECOVERED_JUMPTABLE = (obj->gc).size;
  if (UNRECOVERED_JUMPTABLE != (gravity_gc_callback)0x0) {
    uVar10 = (*UNRECOVERED_JUMPTABLE)(vm,obj);
    return uVar10;
  }
  if (pgVar14 == gravity_class_class) {
    (obj->gc).visited = true;
    uVar10 = obj->nivars;
    uVar9 = string_size(obj->identifier);
    uVar10 = uVar10 * 0x10 + uVar9 + 0x78;
    gravity_hash_iterate2(obj->htable,gravity_hash_internalsize,&stack0xffffffffffffffdc,vm);
    gravity_hash_memsize(obj->htable);
    pgVar11 = gravity_vm_delegate(vm);
    if (((gravity_object_t *)obj->xdata != (gravity_object_t *)0x0) &&
       (pgVar11->bridge_size != (gravity_bridge_size)0x0)) {
      uVar9 = (*pgVar11->bridge_size)(vm,(gravity_object_t *)obj->xdata);
      uVar10 = uVar10 + uVar9;
    }
    (obj->gc).visited = false;
    return uVar10;
  }
  if (pgVar14 == gravity_class_function) {
    (obj->gc).visited = true;
    uVar10 = string_size(obj->identifier);
    uVar10 = uVar10 + 0xb8;
    iVar13 = *(int *)&obj->xdata;
    if (iVar13 == 3) {
      pcVar3 = obj->superlook;
      if (pcVar3 != (char *)0x0) {
        plVar6 = *(long **)(pcVar3 + 0x48);
        iVar13 = 0x58;
        if ((plVar6 != (long *)0x0) && (*plVar6 != 0)) {
          lVar16 = 8;
          do {
            plVar2 = (long *)((long)plVar6 + lVar16);
            lVar16 = lVar16 + 8;
          } while (*plVar2 != 0);
          iVar13 = (int)lVar16 + 0x50;
        }
        pcVar3[9] = '\0';
        uVar10 = uVar10 + iVar13;
      }
      pgVar4 = obj->htable;
      if ((pgVar4 != (gravity_hash_t *)0x0) && ((gravity_hash_t *)obj->superlook != pgVar4)) {
        p_Var5 = pgVar4[1].compute_fn;
        iVar13 = 0x58;
        if ((p_Var5 != (gravity_hash_compute_fn)0x0) && (*(long *)p_Var5 != 0)) {
          lVar16 = 8;
          do {
            p_Var1 = p_Var5 + lVar16;
            lVar16 = lVar16 + 8;
          } while (*(long *)p_Var1 != 0);
          iVar13 = (int)lVar16 + 0x50;
        }
        *(undefined1 *)((long)&pgVar4->nodes + 1) = 0;
        uVar10 = uVar10 + iVar13;
      }
    }
    else if (iVar13 == 2) {
      pgVar11 = gravity_vm_delegate(vm);
      if ((obj->objclass != (gravity_object_t *)0x0) &&
         (pgVar11->bridge_size != (gravity_bridge_size)0x0)) {
        uVar9 = (*pgVar11->bridge_size)(vm,obj->objclass);
        uVar10 = uVar9 + uVar10;
      }
    }
    else if (iVar13 == 0) {
      if (obj[1].gc.next != (gravity_object_t *)0x0) {
        uVar10 = uVar10 + *(int *)&obj[1].gc.blacken * 4;
      }
      pgVar15 = obj->superclass;
      if (pgVar15 != (gravity_class_s *)0x0) {
        lVar16 = 8;
        do {
          aVar7 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                  ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
                  ((long)&obj->htable->size + lVar16))->p;
          v.field_1.p = (gravity_object_t *)aVar7.n;
          v.isa = *(gravity_class_t **)((long)obj->htable + lVar16 + -8);
          _Var8 = gravity_value_isobject(v);
          uVar9 = 0;
          if (_Var8) {
            uVar9 = gravity_object_size(vm,aVar7.p);
          }
          uVar10 = uVar10 + uVar9;
          lVar16 = lVar16 + 0x10;
          pgVar15 = (gravity_class_s *)((long)&pgVar15[-1].ivars + 7);
        } while (pgVar15 != (gravity_class_s *)0x0);
      }
    }
    (obj->gc).visited = false;
    return uVar10;
  }
  if (pgVar14 == gravity_class_closure) {
    plVar6 = (long *)obj->xdata;
    uVar10 = 0x58;
    if ((plVar6 != (long *)0x0) && (*plVar6 != 0)) {
      lVar16 = 8;
      do {
        plVar2 = (long *)((long)plVar6 + lVar16);
        lVar16 = lVar16 + 8;
      } while (*plVar2 != 0);
      uVar10 = (int)lVar16 + 0x50;
    }
  }
  else {
    if (pgVar14 == gravity_class_instance) {
      (obj->gc).visited = true;
      uVar10 = obj->objclass->nivars * 0x10 + 0x48;
      pgVar11 = gravity_vm_delegate(vm);
      if (((gravity_object_t *)obj->identifier != (gravity_object_t *)0x0) &&
         (pgVar11->bridge_size != (gravity_bridge_size)0x0)) {
        uVar9 = (*pgVar11->bridge_size)(vm,(gravity_object_t *)obj->identifier);
        uVar10 = uVar10 + uVar9;
      }
      (obj->gc).visited = false;
      return uVar10;
    }
    if (pgVar14 == gravity_class_list) {
      (obj->gc).visited = true;
      pgVar14 = obj->objclass;
      if (pgVar14 == (gravity_class_t *)0x0) {
        uVar10 = 0x48;
      }
      else {
        iVar13 = 0;
        lVar16 = 8;
        do {
          aVar7 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                  ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
                  (*(long *)&obj->has_outer + lVar16))->p;
          v_00.field_1.p = (gravity_object_t *)aVar7.n;
          v_00.isa = *(gravity_class_t **)(*(long *)&obj->has_outer + -8 + lVar16);
          _Var8 = gravity_value_isobject(v_00);
          uVar10 = 0;
          if (_Var8) {
            uVar10 = gravity_object_size(vm,aVar7.p);
          }
          iVar13 = iVar13 + uVar10;
          lVar16 = lVar16 + 0x10;
          pgVar14 = (gravity_class_t *)((long)&pgVar14[-1].ivars + 7);
        } while (pgVar14 != (gravity_class_t *)0x0);
        uVar10 = iVar13 + 0x48;
      }
      (obj->gc).visited = false;
      return uVar10;
    }
    if (pgVar14 == gravity_class_map) {
      (obj->gc).visited = true;
      gravity_hash_iterate2
                ((gravity_hash_t *)obj->objclass,gravity_hash_internalsize,&stack0xffffffffffffffec,
                 vm);
      uVar10 = gravity_hash_memsize((gravity_hash_t *)obj->objclass);
      (obj->gc).visited = false;
      return uVar10 + 0x38;
    }
    if (pgVar14 == gravity_class_fiber) {
      (obj->gc).visited = true;
      iVar13 = *(int *)&obj->has_outer * 0x10 + *(int *)((long)&obj->superclass + 4) * 0x30 + 0xa8;
      pgVar12 = (gravity_class_t *)obj->identifier;
      for (pgVar14 = obj->objclass; pgVar14 < pgVar12;
          pgVar14 = (gravity_class_t *)
                    ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)&pgVar14->gc + 1)) {
        obj_00 = ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)&pgVar14->gc)->p;
        _Var8 = gravity_value_isobject(*(gravity_value_t *)pgVar14);
        uVar10 = 0;
        if (_Var8) {
          uVar10 = gravity_object_size(vm,obj_00);
          pgVar12 = (gravity_class_t *)obj->identifier;
        }
        iVar13 = iVar13 + uVar10;
      }
      uVar10 = string_size((char *)obj->htable);
      uVar9 = gravity_object_size(vm,(gravity_object_t *)obj->ivars);
      (obj->gc).visited = false;
      return uVar9 + uVar10 + iVar13;
    }
    if (pgVar14 == gravity_class_range) {
      (obj->gc).visited = false;
      return 0x40;
    }
    if (pgVar14 == gravity_class_module) {
      (obj->gc).visited = true;
      gravity_hash_iterate2
                ((gravity_hash_t *)obj->identifier,gravity_hash_internalsize,
                 &stack0xffffffffffffffe4,vm);
      uVar10 = string_size((char *)obj->objclass);
      uVar9 = gravity_hash_memsize((gravity_hash_t *)obj->identifier);
      (obj->gc).visited = false;
      return uVar9 + uVar10 + 0x40;
    }
    if (pgVar14 != gravity_class_string) {
      if (pgVar14 != gravity_class_upvalue) {
        return 0;
      }
      (obj->gc).visited = false;
      return 0x50;
    }
    uVar10 = *(int *)&obj->has_outer + 0x48;
  }
  (obj->gc).visited = false;
  return uVar10;
}

Assistant:

uint32_t gravity_object_size (gravity_vm *vm, gravity_object_t *obj) {
    if ((!obj) || (!OBJECT_IS_VALID(obj))) return 0;
    
    // check if object has already been visited (to avoid infinite loop)
    if (obj->gc.visited) return 0;
    
    if (obj->gc.size) return obj->gc.size(vm, obj);
    else if (OBJECT_ISA_CLASS(obj)) return gravity_class_size(vm, (gravity_class_t *)obj);
    else if (OBJECT_ISA_FUNCTION(obj)) return gravity_function_size(vm, (gravity_function_t *)obj);
    else if (OBJECT_ISA_CLOSURE(obj)) return gravity_closure_size(vm, (gravity_closure_t *)obj);
    else if (OBJECT_ISA_INSTANCE(obj)) return gravity_instance_size(vm, (gravity_instance_t *)obj);
    else if (OBJECT_ISA_LIST(obj)) return gravity_list_size(vm, (gravity_list_t *)obj);
    else if (OBJECT_ISA_MAP(obj)) return gravity_map_size(vm, (gravity_map_t *)obj);
    else if (OBJECT_ISA_FIBER(obj)) return gravity_fiber_size(vm, (gravity_fiber_t *)obj);
    else if (OBJECT_ISA_RANGE(obj)) return gravity_range_size(vm, (gravity_range_t *)obj);
    else if (OBJECT_ISA_MODULE(obj)) return gravity_module_size(vm, (gravity_module_t *)obj);
    else if (OBJECT_ISA_STRING(obj)) return gravity_string_size(vm, (gravity_string_t *)obj);
    else if (OBJECT_ISA_UPVALUE(obj)) return gravity_upvalue_size(vm, (gravity_upvalue_t *)obj);
    return 0;
}